

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O1

float Abc_NtkDelayTraceLut(Abc_Ntk_t *pNtk,int fUseLutLib)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  void **ppvVar5;
  int *piVar6;
  size_t __size;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  float *pfVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_138 [32];
  float local_b8 [34];
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                  ,0x6f,"float Abc_NtkDelayTraceLut(Abc_Ntk_t *, int)");
  }
  if (fUseLutLib == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = Abc_FrameReadLibLut();
  }
  if ((pvVar9 == (void *)0x0) ||
     (iVar1 = *(int *)((long)pvVar9 + 8), iVar7 = Abc_NtkGetFaninMax(pNtk), iVar7 <= iVar1)) {
    if (pNtk->pLutTimes != (float *)0x0) {
      free(pNtk->pLutTimes);
      pNtk->pLutTimes = (float *)0x0;
    }
    lVar19 = (long)pNtk->vObjs->nSize;
    __size = lVar19 * 0xc;
    pfVar10 = (float *)malloc(__size);
    pNtk->pLutTimes = pfVar10;
    if (0 < lVar19) {
      sVar13 = 0;
      do {
        *(undefined4 *)((long)pfVar10 + sVar13 + 8) = 0;
        *(undefined8 *)((long)pfVar10 + sVar13) = 0x4e6e6b2800000000;
        sVar13 = sVar13 + 0xc;
      } while (__size != sVar13);
    }
    pVVar11 = Abc_NtkDfs(pNtk,1);
    if (0 < pVVar11->nSize) {
      lVar19 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pVVar11->pArray[lVar19];
        if (pvVar9 == (void *)0x0) {
          lVar12 = (long)(pAVar3->vFanins).nSize;
          fVar20 = -1e+09;
          if (0 < lVar12) {
            lVar15 = 0;
            fVar21 = -1e+09;
            do {
              plVar4 = (long *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar15]];
              fVar22 = *(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc);
              fVar20 = fVar22 + 1.0;
              if (fVar22 + 1.0 <= fVar21) {
                fVar20 = fVar21;
              }
              lVar15 = lVar15 + 1;
              fVar21 = fVar20;
            } while (lVar12 != lVar15);
          }
        }
        else {
          uVar2 = (pAVar3->vFanins).nSize;
          if (*(int *)((long)pvVar9 + 0xc) == 0) {
            fVar20 = -1e+09;
            if (0 < (int)uVar2) {
              uVar14 = 0;
              fVar21 = -1e+09;
              do {
                plVar4 = (long *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[uVar14]];
                fVar20 = *(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) +
                         *(float *)((long)pvVar9 + (ulong)uVar2 * 0x84 + 0x94);
                if (fVar20 <= fVar21) {
                  fVar20 = fVar21;
                }
                uVar14 = uVar14 + 1;
                fVar21 = fVar20;
              } while (uVar2 != uVar14);
            }
          }
          else {
            Abc_NtkDelayTraceSortPins(pAVar3,local_138,local_b8);
            lVar12 = (long)(pAVar3->vFanins).nSize;
            fVar20 = -1e+09;
            if (0 < lVar12) {
              lVar15 = 0;
              fVar21 = -1e+09;
              do {
                plVar4 = (long *)pAVar3->pNtk->vObjs->pArray
                                 [(pAVar3->vFanins).pArray[local_138[lVar15]]];
                fVar20 = *(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) +
                         *(float *)((long)pvVar9 + lVar15 * 4 + (long)(int)uVar2 * 0x84 + 0x94);
                if (fVar20 <= fVar21) {
                  fVar20 = fVar21;
                }
                lVar15 = lVar15 + 1;
                fVar21 = fVar20;
              } while (lVar12 != lVar15);
            }
          }
        }
        fVar21 = 0.0;
        if ((pAVar3->vFanins).nSize != 0) {
          fVar21 = fVar20;
        }
        pAVar3->pNtk->pLutTimes[(long)pAVar3->Id * 3] = fVar21;
        lVar19 = lVar19 + 1;
      } while (lVar19 < pVVar11->nSize);
    }
    if (pVVar11->pArray != (void **)0x0) {
      free(pVVar11->pArray);
      pVVar11->pArray = (void **)0x0;
    }
    if (pVVar11 != (Vec_Ptr_t *)0x0) {
      free(pVVar11);
    }
    pVVar11 = pNtk->vCos;
    lVar19 = (long)pVVar11->nSize;
    if (lVar19 < 1) {
      fVar20 = -1e+09;
    }
    else {
      fVar20 = -1e+09;
      lVar12 = 0;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(*pVVar11->pArray[lVar12] + 0x20) + 8) +
                           (long)**(int **)((long)pVVar11->pArray[lVar12] + 0x20) * 8);
        fVar21 = *(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc);
        if (fVar21 <= fVar20) {
          fVar21 = fVar20;
        }
        fVar20 = fVar21;
        lVar12 = lVar12 + 1;
      } while (lVar19 != lVar12);
    }
    if (0 < pVVar11->nSize) {
      ppvVar5 = pVVar11->pArray;
      lVar12 = 0;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(*ppvVar5[lVar12] + 0x20) + 8) +
                           (long)**(int **)((long)ppvVar5[lVar12] + 0x20) * 8);
        lVar15 = *(long *)(*plVar4 + 400);
        lVar16 = (long)(int)plVar4[2];
        if (fVar20 < *(float *)(lVar15 + 4 + lVar16 * 0xc)) {
          *(float *)(lVar15 + 4 + lVar16 * 0xc) = fVar20;
        }
        lVar12 = lVar12 + 1;
      } while (lVar19 != lVar12);
    }
    pVVar11 = Abc_NtkDfsReverse(pNtk);
    if (0 < pVVar11->nSize) {
      lVar19 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pVVar11->pArray[lVar19];
        if (pvVar9 == (void *)0x0) {
          fVar21 = pAVar3->pNtk->pLutTimes[(long)pAVar3->Id * 3 + 1] + -1.0;
          lVar12 = (long)(pAVar3->vFanins).nSize;
          if (0 < lVar12) {
            ppvVar5 = pAVar3->pNtk->vObjs->pArray;
            piVar6 = (pAVar3->vFanins).pArray;
            lVar15 = 0;
            do {
              plVar4 = (long *)ppvVar5[piVar6[lVar15]];
              lVar16 = *(long *)(*plVar4 + 400);
              lVar17 = (long)(int)plVar4[2];
              if (fVar21 < *(float *)(lVar16 + 4 + lVar17 * 0xc)) {
                *(float *)(lVar16 + 4 + lVar17 * 0xc) = fVar21;
              }
              lVar15 = lVar15 + 1;
            } while (lVar12 != lVar15);
          }
        }
        else {
          iVar1 = (pAVar3->vFanins).nSize;
          lVar12 = (long)iVar1;
          if (*(int *)((long)pvVar9 + 0xc) == 0) {
            if (0 < iVar1) {
              fVar21 = pAVar3->pNtk->pLutTimes[(long)pAVar3->Id * 3 + 1] -
                       *(float *)((long)pvVar9 + lVar12 * 0x84 + 0x94);
              ppvVar5 = pAVar3->pNtk->vObjs->pArray;
              piVar6 = (pAVar3->vFanins).pArray;
              lVar15 = 0;
              do {
                plVar4 = (long *)ppvVar5[piVar6[lVar15]];
                lVar16 = *(long *)(*plVar4 + 400);
                lVar17 = (long)(int)plVar4[2];
                if (fVar21 < *(float *)(lVar16 + 4 + lVar17 * 0xc)) {
                  *(float *)(lVar16 + 4 + lVar17 * 0xc) = fVar21;
                }
                lVar15 = lVar15 + 1;
              } while (lVar12 != lVar15);
            }
          }
          else {
            Abc_NtkDelayTraceSortPins(pAVar3,local_138,local_b8);
            lVar15 = (long)(pAVar3->vFanins).nSize;
            if (0 < lVar15) {
              piVar6 = (pAVar3->vFanins).pArray;
              pfVar10 = pAVar3->pNtk->pLutTimes;
              ppvVar5 = pAVar3->pNtk->vObjs->pArray;
              iVar1 = pAVar3->Id;
              lVar16 = 0;
              do {
                fVar21 = pfVar10[(long)iVar1 * 3 + 1] -
                         *(float *)((long)pvVar9 + lVar16 * 4 + lVar12 * 0x84 + 0x94);
                plVar4 = (long *)ppvVar5[piVar6[local_138[lVar16]]];
                lVar17 = *(long *)(*plVar4 + 400);
                lVar18 = (long)(int)plVar4[2];
                if (fVar21 < *(float *)(lVar17 + 4 + lVar18 * 0xc)) {
                  *(float *)(lVar17 + 4 + lVar18 * 0xc) = fVar21;
                }
                lVar16 = lVar16 + 1;
              } while (lVar15 != lVar16);
            }
          }
        }
        pfVar10 = pAVar3->pNtk->pLutTimes;
        lVar12 = (long)pAVar3->Id;
        fVar21 = pfVar10[lVar12 * 3 + 1] - pfVar10[lVar12 * 3];
        if (fVar21 + 0.001 <= 0.0) {
          __assert_fail("tSlack + 0.001 > 0.0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                        ,0xe2,"float Abc_NtkDelayTraceLut(Abc_Ntk_t *, int)");
        }
        fVar22 = 0.0;
        if (0.0 <= fVar21) {
          fVar22 = fVar21;
        }
        pfVar10[lVar12 * 3 + 2] = fVar22;
        lVar19 = lVar19 + 1;
      } while (lVar19 < pVVar11->nSize);
    }
    if (pVVar11->pArray != (void **)0x0) {
      free(pVVar11->pArray);
      pVVar11->pArray = (void **)0x0;
    }
    if (pVVar11 != (Vec_Ptr_t *)0x0) {
      free(pVVar11);
    }
  }
  else {
    uVar2 = *(uint *)((long)pvVar9 + 8);
    uVar8 = Abc_NtkGetFaninMax(pNtk);
    printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar2,
           (ulong)uVar8);
    fVar20 = -1e+09;
  }
  return fVar20;
}

Assistant:

float Abc_NtkDelayTraceLut( Abc_Ntk_t * pNtk, int fUseLutLib )
{
    int fUseSorting = 1;
    int pPinPerm[32];
    float pPinDelays[32];
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pNode, * pFanin;
    Vec_Ptr_t * vNodes;
    float tArrival, tRequired, tSlack, * pDelays;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) );
    // get the library
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    if ( pLutLib && pLutLib->LutMax < Abc_NtkGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Abc_NtkGetFaninMax(pNtk) );
        return -ABC_INFINITY;
    }

    // initialize the arrival times
    ABC_FREE( pNtk->pLutTimes );
    pNtk->pLutTimes = ABC_ALLOC( float, 3 * Abc_NtkObjNumMax(pNtk) );
    for ( i = 0; i < Abc_NtkObjNumMax(pNtk); i++ )
    {
        pNtk->pLutTimes[3*i+0] = pNtk->pLutTimes[3*i+2] = 0;
        pNtk->pLutTimes[3*i+1] = ABC_INFINITY;
    }

    // propagate arrival times
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        tArrival = -ABC_INFINITY;
        if ( pLutLib == NULL )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( tArrival < Abc_ObjArrival(pFanin) + 1.0 )
                    tArrival = Abc_ObjArrival(pFanin) + 1.0;
        }
        else if ( !pLutLib->fVarPinDelays )
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( tArrival < Abc_ObjArrival(pFanin) + pDelays[0] )
                    tArrival = Abc_ObjArrival(pFanin) + pDelays[0];
        }
        else
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            if ( fUseSorting )
            {
                Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
                Abc_ObjForEachFanin( pNode, pFanin, k ) 
                    if ( tArrival < Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k] )
                        tArrival = Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k];
            }
            else
            {
                Abc_ObjForEachFanin( pNode, pFanin, k )
                    if ( tArrival < Abc_ObjArrival(pFanin) + pDelays[k] )
                        tArrival = Abc_ObjArrival(pFanin) + pDelays[k];
            }
        }
        if ( Abc_ObjFaninNum(pNode) == 0 )
            tArrival = 0.0;
        Abc_ObjSetArrival( pNode, tArrival );
    }
    Vec_PtrFree( vNodes );

    // get the latest arrival times
    tArrival = -ABC_INFINITY;
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( tArrival < Abc_ObjArrival(Abc_ObjFanin0(pNode)) )
            tArrival = Abc_ObjArrival(Abc_ObjFanin0(pNode));

    // initialize the required times
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( Abc_ObjRequired(Abc_ObjFanin0(pNode)) > tArrival )
            Abc_ObjSetRequired( Abc_ObjFanin0(pNode), tArrival );

    // propagate the required times
    vNodes = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( pLutLib == NULL )
        {
            tRequired = Abc_ObjRequired(pNode) - (float)1.0;
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( Abc_ObjRequired(pFanin) > tRequired )
                    Abc_ObjSetRequired( pFanin, tRequired );
        }
        else if ( !pLutLib->fVarPinDelays )
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            tRequired = Abc_ObjRequired(pNode) - pDelays[0];
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( Abc_ObjRequired(pFanin) > tRequired )
                    Abc_ObjSetRequired( pFanin, tRequired );
        }
        else 
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            if ( fUseSorting )
            {
                Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
                Abc_ObjForEachFanin( pNode, pFanin, k )
                {
                    tRequired = Abc_ObjRequired(pNode) - pDelays[k];
                    if ( Abc_ObjRequired(Abc_ObjFanin(pNode,pPinPerm[k])) > tRequired )
                        Abc_ObjSetRequired( Abc_ObjFanin(pNode,pPinPerm[k]), tRequired );
                }
            }
            else
            {
                Abc_ObjForEachFanin( pNode, pFanin, k )
                {
                    tRequired = Abc_ObjRequired(pNode) - pDelays[k];
                    if ( Abc_ObjRequired(pFanin) > tRequired )
                        Abc_ObjSetRequired( pFanin, tRequired );
                }
            }
        }
        // set slack for this object
        tSlack = Abc_ObjRequired(pNode) - Abc_ObjArrival(pNode);
        assert( tSlack + 0.001 > 0.0 );
        Abc_ObjSetSlack( pNode, tSlack < 0.0 ? 0.0 : tSlack );
    }
    Vec_PtrFree( vNodes );
    return tArrival;
}